

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O2

void * kmpc_realloc(void *ptr,size_t size)

{
  int iVar1;
  kmp_info_t *pkVar2;
  void *pvVar3;
  
  if (ptr == (void *)0x0) {
    pkVar2 = __kmp_entry_thread();
    pvVar3 = bget(pkVar2,size + 8);
  }
  else {
    if (size == 0) {
      if (*(long *)((long)ptr + -8) != 0) {
        iVar1 = __kmp_get_global_thread_id();
        brel(__kmp_threads[iVar1],*(void **)((long)ptr + -8));
        return (void *)0x0;
      }
      __kmp_debug_assert("assertion failure",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_alloc.cpp"
                         ,0x486);
    }
    pkVar2 = __kmp_entry_thread();
    pvVar3 = bgetr(pkVar2,*(void **)((long)ptr + -8),size + 8);
  }
  if (pvVar3 == (void *)0x0) {
    return (void *)0x0;
  }
  *(void **)pvVar3 = pvVar3;
  return (void *)((long)pvVar3 + 8);
}

Assistant:

void *kmpc_realloc(void *ptr, size_t size) {
  void *result = NULL;
  if (ptr == NULL) {
    // If pointer is NULL, realloc behaves like malloc.
    result = bget(__kmp_entry_thread(), (bufsize)(size + sizeof(ptr)));
    // save allocated pointer just before one returned to user
    if (result != NULL) {
      *(void **)result = result;
      result = (void **)result + 1;
    }
  } else if (size == 0) {
    // If size is 0, realloc behaves like free.
    // The thread must be registered by the call to kmpc_malloc() or
    // kmpc_calloc() before.
    // So it should be safe to call __kmp_get_thread(), not
    // __kmp_entry_thread().
    KMP_ASSERT(*((void **)ptr - 1));
    brel(__kmp_get_thread(), *((void **)ptr - 1));
  } else {
    result = bgetr(__kmp_entry_thread(), *((void **)ptr - 1),
                   (bufsize)(size + sizeof(ptr)));
    if (result != NULL) {
      *(void **)result = result;
      result = (void **)result + 1;
    }
  }
  return result;
}